

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ossadmin_stop_oss.cc
# Opt level: O2

int __thiscall
aliyun::OssAdmin::stopOss
          (OssAdmin *this,OssAdminstopOssRequestType *req,OssAdminstopOssResponseType *response,
          OssAdminErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  char *pcVar5;
  allocator<char> local_421;
  Value val;
  string local_408;
  allocator<char> local_3e3;
  allocator<char> local_3e2;
  allocator<char> local_3e1;
  string str_response;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar5 = "http";
  if (this->use_tls_ != false) {
    pcVar5 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar5,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_408);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&val);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,this->secret_,&local_421);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar5 = this->proxy_host_, pcVar5 != (char *)0x0)) &&
     (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar5,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&local_408);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"stopOss",&local_421);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"OwnerId",(allocator<char> *)&local_408);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"ResourceOwnerAccount",(allocator<char> *)&local_408);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"ResourceOwnerId",(allocator<char> *)&local_408);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->region)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"region",(allocator<char> *)&local_408);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->region);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"OwnerAccount",(allocator<char> *)&local_408);
    std::__cxx11::string::string((string *)&local_380,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"RegionId",(allocator<char> *)&local_408);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,this->region_id_,&local_421);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3a0,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (OssAdminErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_408,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,anon_var_dwarf_8a3b4 + 9,&local_421);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_408);
        std::__cxx11::string::~string((string *)&local_408);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_408,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,anon_var_dwarf_8a3b4 + 9,&local_3e1);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_408);
        std::__cxx11::string::~string((string *)&local_408);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_408,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,anon_var_dwarf_8a3b4 + 9,&local_3e2);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_408);
        std::__cxx11::string::~string((string *)&local_408);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_408,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,anon_var_dwarf_8a3b4 + 9,&local_3e3);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_408);
        std::__cxx11::string::~string((string *)&local_408);
      }
      if (response != (OssAdminstopOssResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_408,pVVar4);
          std::__cxx11::string::operator=((string *)response,(string *)&local_408);
          std::__cxx11::string::~string((string *)&local_408);
        }
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_408,pVVar4);
          std::__cxx11::string::operator=((string *)&response->message,(string *)&local_408);
          std::__cxx11::string::~string((string *)&local_408);
        }
        bVar1 = Json::Value::isMember(&val,"Success");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Success");
          bVar1 = Json::Value::asBool(pVVar4);
          response->success = bVar1;
        }
        bVar1 = Json::Value::isMember(&val,"aliUid");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"aliUid");
          IVar3 = Json::Value::asInt(pVVar4);
          response->ali_uid = (long)IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"instanceId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"instanceId");
          Json::Value::asString_abi_cxx11_(&local_408,pVVar4);
          std::__cxx11::string::operator=((string *)&response->instance_id,(string *)&local_408);
          std::__cxx11::string::~string((string *)&local_408);
        }
        bVar1 = Json::Value::isMember(&val,"instacneStatus");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"instacneStatus");
          Json::Value::asString_abi_cxx11_(&local_408,pVVar4);
          std::__cxx11::string::operator=((string *)&response->instacne_status,(string *)&local_408)
          ;
          std::__cxx11::string::~string((string *)&local_408);
        }
        bVar1 = Json::Value::isMember(&val,"instanceName");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"instanceName");
          Json::Value::asString_abi_cxx11_(&local_408,pVVar4);
          std::__cxx11::string::operator=((string *)&response->instance_name,(string *)&local_408);
          std::__cxx11::string::~string((string *)&local_408);
        }
        bVar1 = Json::Value::isMember(&val,"startTime");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"startTime");
          Json::Value::asString_abi_cxx11_(&local_408,pVVar4);
          std::__cxx11::string::operator=((string *)&response->start_time,(string *)&local_408);
          std::__cxx11::string::~string((string *)&local_408);
        }
        bVar1 = Json::Value::isMember(&val,"endTime");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"endTime");
          Json::Value::asString_abi_cxx11_(&local_408,pVVar4);
          std::__cxx11::string::operator=((string *)&response->end_time,(string *)&local_408);
          std::__cxx11::string::~string((string *)&local_408);
        }
      }
      goto LAB_00128f9f;
    }
  }
  iVar2 = -1;
  if (error_info != (OssAdminErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00128f9f:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int OssAdmin::stopOss(const OssAdminstopOssRequestType& req,
                      OssAdminstopOssResponseType* response,
                       OssAdminErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","stopOss");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.region.empty()) {
    req_rpc->AddRequestQuery("region", req.region);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}